

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O2

void Dch_PerformRandomSimulation(Aig_Man_t *pAig,Vec_Ptr_t *vSims)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  uint *puVar4;
  Aig_Obj_t *pAVar5;
  uint *puVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  pvVar2 = Vec_PtrEntry(vSims,1);
  uVar11 = 0;
  pvVar3 = Vec_PtrEntry(vSims,0);
  uVar8 = (ulong)((long)pvVar2 - (long)pvVar3) >> 2;
  puVar4 = Dch_ObjSim(vSims,pAig->pConst1);
  memset(puVar4,0xff,((long)pvVar2 - (long)pvVar3) * 0x40000000 >> 0x1e & 0xfffffffffffffffc);
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = uVar11;
  }
  while( true ) {
    iVar10 = (int)uVar11;
    if (pAig->vCis->nSize <= iVar10) break;
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iVar10);
    puVar4 = Dch_ObjSim(vSims,pAVar5);
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = Aig_ManRandom(0);
      puVar4[uVar8] = uVar1;
    }
    *puVar4 = *puVar4 << 1;
    uVar11 = (ulong)(iVar10 + 1);
  }
  for (iVar10 = 0; iVar10 < pAig->vObjs->nSize; iVar10 = iVar10 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar10);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
      puVar4 = Dch_ObjSim(vSims,(Aig_Obj_t *)((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe));
      puVar6 = Dch_ObjSim(vSims,(Aig_Obj_t *)((ulong)pAVar5->pFanin1 & 0xfffffffffffffffe));
      puVar7 = Dch_ObjSim(vSims,pAVar5);
      if (((ulong)pAVar5->pFanin0 & 1) == 0) {
        if (((ulong)pAVar5->pFanin1 & 1) == 0) {
          for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
            puVar7[uVar8] = puVar6[uVar8] & puVar4[uVar8];
          }
        }
        else {
          for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
            puVar7[uVar8] = ~puVar6[uVar8] & puVar4[uVar8];
          }
        }
      }
      else if (((ulong)pAVar5->pFanin1 & 1) == 0) {
        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          puVar7[uVar8] = ~puVar4[uVar8] & puVar6[uVar8];
        }
      }
      else {
        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          puVar7[uVar8] = ~(puVar6[uVar8] | puVar4[uVar8]);
        }
      }
    }
  }
  return;
}

Assistant:

void Dch_PerformRandomSimulation( Aig_Man_t * pAig, Vec_Ptr_t * vSims )
{
    unsigned * pSim, * pSim0, * pSim1;
    Aig_Obj_t * pObj;
    int i, k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);

    // assign const 1 sim info
    pObj = Aig_ManConst1(pAig);
    pSim = Dch_ObjSim( vSims, pObj );
    memset( pSim, 0xff, sizeof(unsigned) * nWords );

    // assign primary input random sim info
    Aig_ManForEachCi( pAig, pObj, i )
    {
        pSim = Dch_ObjSim( vSims, pObj );
        for ( k = 0; k < nWords; k++ )
            pSim[k] = Dch_ObjRandomSim();
        pSim[0] <<= 1;
    }

    // simulate AIG in the topological order
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pSim0 = Dch_ObjSim( vSims, Aig_ObjFanin0(pObj) ); 
        pSim1 = Dch_ObjSim( vSims, Aig_ObjFanin1(pObj) ); 
        pSim  = Dch_ObjSim( vSims, pObj );

        if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // both are compls
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = ~pSim0[k] & ~pSim1[k];
        }
        else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) ) // first one is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = ~pSim0[k] & pSim1[k];
        }
        else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // second one is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = pSim0[k] & ~pSim1[k];
        }
        else // if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) ) // none is compl
        {
            for ( k = 0; k < nWords; k++ )
                pSim[k] = pSim0[k] & pSim1[k];
        }
    }
    // get simulation information for primary outputs
}